

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

iterator * __thiscall pybind11::detail::values_and_holders::iterator::operator++(iterator *this)

{
  ulong uVar1;
  const_reference pptVar2;
  size_type sVar3;
  value_type local_28;
  iterator *this_local;
  
  if (((byte)this->inst->field_0x30 >> 1 & 1) == 0) {
    pptVar2 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::operator[](this->types,(this->curr).index);
    (this->curr).vh = (this->curr).vh + (*pptVar2)->holder_size_in_ptrs + 1;
  }
  (this->curr).index = (this->curr).index + 1;
  uVar1 = (this->curr).index;
  sVar3 = std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
          ::size(this->types);
  if (uVar1 < sVar3) {
    pptVar2 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::operator[](this->types,(this->curr).index);
    local_28 = *pptVar2;
  }
  else {
    local_28 = (value_type)0x0;
  }
  (this->curr).type = local_28;
  return this;
}

Assistant:

iterator &operator++() {
            if (!inst->simple_layout)
                curr.vh += 1 + (*types)[curr.index]->holder_size_in_ptrs;
            ++curr.index;
            curr.type = curr.index < types->size() ? (*types)[curr.index] : nullptr;
            return *this;
        }